

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O0

void soul::catchParseErrors(function<void_()> *functionToPerform)

{
  ErrorWasIgnoredException anon_var_1;
  undefined1 local_38 [8];
  ParseErrorIgnoringMessageHandler handler;
  function<void_()> *functionToPerform_local;
  
  handler.super_CompileMessageHandler.lastHandler = (CompileMessageHandler *)functionToPerform;
  catchParseErrors::ParseErrorIgnoringMessageHandler::ParseErrorIgnoringMessageHandler
            ((ParseErrorIgnoringMessageHandler *)local_38);
  std::function<void_()>::operator()
            ((function<void_()> *)handler.super_CompileMessageHandler.lastHandler);
  catchParseErrors::ParseErrorIgnoringMessageHandler::~ParseErrorIgnoringMessageHandler
            ((ParseErrorIgnoringMessageHandler *)local_38);
  return;
}

Assistant:

void catchParseErrors (std::function<void()>&& functionToPerform)
{
    struct ErrorWasIgnoredException {};

    struct ParseErrorIgnoringMessageHandler  : public CompileMessageHandler
    {
        ParseErrorIgnoringMessageHandler()
            : CompileMessageHandler ([this] (const CompileMessageGroup& messageGroup)
                                     {
                                         for (auto& m : messageGroup.messages)
                                             if (! m.isInternalCompilerError())
                                                 throw ErrorWasIgnoredException();

                                         if (lastHandler != nullptr)
                                             lastHandler->handleMessageFn (messageGroup);
                                     })
        {}
    };

    try
    {
        ParseErrorIgnoringMessageHandler handler;
        functionToPerform();
    }
    catch (ErrorWasIgnoredException) {}
}